

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O1

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,TypeAliasType *type,string_view overrideName)

{
  Type *pTVar1;
  string path;
  string local_48;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_str = overrideName._M_str;
  local_28._M_len = overrideName._M_len;
  if (local_28._M_len == 0) {
    if ((this->options).elideScopeNames == true) {
      pTVar1 = DeclaredType::getType(&type->targetType);
      Symbol::
      visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>const&>
                (&pTVar1->super_Symbol,this,&(type->super_Type).super_Symbol.name);
      return;
    }
    getLexicalPath_abi_cxx11_
              (&local_48,(ast *)(type->super_Type).super_Symbol.parentScope,(Scope *)0x0);
    std::__cxx11::string::append
              ((char *)&local_48,(ulong)(type->super_Type).super_Symbol.name._M_str);
    pTVar1 = DeclaredType::getType(&type->targetType);
    Symbol::visit<slang::ast::TypePrinter&,std::__cxx11::string&>
              (&pTVar1->super_Symbol,this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pTVar1 = DeclaredType::getType(&type->targetType);
    Symbol::visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>&>
              (&pTVar1->super_Symbol,this,&local_28);
  }
  return;
}

Assistant:

void TypePrinter::visit(const TypeAliasType& type, string_view overrideName) {
    if (!overrideName.empty()) {
        type.targetType.getType().visit(*this, overrideName);
    }
    else if (options.elideScopeNames) {
        type.targetType.getType().visit(*this, type.name);
    }
    else {
        std::string path = getLexicalPath(type.getParentScope());
        path.append(type.name);
        type.targetType.getType().visit(*this, path);
    }
}